

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O0

void __thiscall QThread::setServiceLevel(QThread *this,QualityOfService serviceLevel)

{
  long lVar1;
  QThreadPrivate *this_00;
  QualityOfService in_ESI;
  long in_FS_OFFSET;
  QThreadPrivate *d;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffffb8;
  QMutexLocker<QMutex> *in_stack_ffffffffffffffc0;
  QualityOfService in_stack_ffffffffffffffcc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QThread *)0x556c99);
  QMutexLocker<QMutex>::QMutexLocker(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (this_00->threadState == Running) {
    QThreadPrivate::setQualityOfServiceLevel(this_00,in_stack_ffffffffffffffcc);
  }
  else {
    this_00->serviceLevel = in_ESI;
  }
  QMutexLocker<QMutex>::~QMutexLocker(in_stack_ffffffffffffffc0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QThread::setServiceLevel(QualityOfService serviceLevel)
{
    Q_D(QThread);
    QMutexLocker locker(&d->mutex);
    if (d->threadState != QThreadPrivate::Running) {
        d->serviceLevel = serviceLevel;
    } else {
        Q_ASSERT_X(isCurrentThread(), "QThread::setServiceLevel",
                "cannot change quality of service level of a separate, running, thread");
        d->setQualityOfServiceLevel(serviceLevel);
    }
}